

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O0

void __thiscall QueryCompiler::~QueryCompiler(QueryCompiler *this)

{
  bool bVar1;
  iterator this_00;
  reference ppFVar2;
  __normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_> *in_RDI;
  Function *f;
  iterator __end1;
  iterator __begin1;
  vector<Function_*,_std::allocator<Function_*>_> *__range1;
  Function *in_stack_ffffffffffffffc8;
  __normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_> local_18;
  __normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_> *local_10;
  
  local_10 = in_RDI + 8;
  local_18._M_current =
       (Function **)
       std::vector<Function_*,_std::allocator<Function_*>_>::begin
                 ((vector<Function_*,_std::allocator<Function_*>_> *)in_stack_ffffffffffffffc8);
  this_00 = std::vector<Function_*,_std::allocator<Function_*>_>::end
                      ((vector<Function_*,_std::allocator<Function_*>_> *)in_stack_ffffffffffffffc8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc8 = *ppFVar2;
    if (in_stack_ffffffffffffffc8 != (Function *)0x0) {
      Function::~Function((Function *)0x316809);
      operator_delete(in_stack_ffffffffffffffc8);
    }
    __gnu_cxx::__normal_iterator<Function_**,_std::vector<Function_*,_std::allocator<Function_*>_>_>
    ::operator++(&local_18);
  }
  std::
  unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
  ::~unordered_map((unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
                    *)0x316831);
  std::
  unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
  ::~unordered_map((unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
                    *)0x31683f);
  std::vector<Function_*,_std::allocator<Function_*>_>::~vector
            ((vector<Function_*,_std::allocator<Function_*>_> *)this_00._M_current);
  std::vector<View_*,_std::allocator<View_*>_>::~vector
            ((vector<View_*,_std::allocator<View_*>_> *)this_00._M_current);
  std::vector<Query_*,_std::allocator<Query_*>_>::~vector
            ((vector<Query_*,_std::allocator<Query_*>_> *)this_00._M_current);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x316873);
  return;
}

Assistant:

QueryCompiler::~QueryCompiler()
{
    for (Function* f : _functionList)
        delete f;
}